

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_string_createWithPrefix(sysbvm_context_t *context,char *prefix,sysbvm_tuple_t string)

{
  size_t __n;
  sysbvm_object_tuple_t *psVar1;
  size_t __n_00;
  
  __n = strlen(prefix);
  psVar1 = (sysbvm_object_tuple_t *)string;
  if (__n != 0) {
    if ((string & 0xf) == 0 && string != 0) {
      __n_00 = (size_t)*(uint *)(string + 0xc);
    }
    else {
      __n_00 = 0;
    }
    psVar1 = sysbvm_context_allocateByteTuple(context,(context->roots).stringType,__n + __n_00);
    memcpy(&psVar1->field_1,prefix,__n);
    memcpy((void *)((long)&psVar1->field_1 + __n),(void *)(string + 0x10),__n_00);
  }
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_string_createWithPrefix(sysbvm_context_t *context, const char *prefix, sysbvm_tuple_t string)
{
    size_t prefixLen = strlen(prefix);
    if(prefixLen == 0)
        return string;

    size_t stringSize = sysbvm_tuple_getSizeInBytes(string);
    sysbvm_tuple_t result = sysbvm_string_createEmptyWithSize(context, prefixLen + stringSize);
    uint8_t *resultData = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(result)->bytes;
    memcpy(resultData, prefix, prefixLen);
    memcpy(resultData + prefixLen, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, stringSize);
    return result;
}